

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O0

void __thiscall
Js::SharedArrayBuffer::SharedArrayBuffer
          (SharedArrayBuffer *this,SharedContents *contents,DynamicType *type)

{
  SharedContents *this_00;
  ScriptContext *pSVar1;
  long lVar2;
  DynamicType *type_local;
  SharedContents *contents_local;
  SharedArrayBuffer *this_local;
  
  ArrayBufferBase::ArrayBufferBase(&this->super_ArrayBufferBase,type);
  (this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01e41c90;
  this->sharedContents = (Type)0x0;
  if ((contents != (SharedContents *)0x0) && (contents->bufferLength < 0x80000000)) {
    lVar2 = SharedContents::AddRef(contents);
    if (1 < lVar2) {
      this->sharedContents = contents;
      this_00 = this->sharedContents;
      pSVar1 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      SharedContents::AddAgent(this_00,(DWORD_PTR)pSVar1);
      return;
    }
    Throw::FatalInternalError(-0x7fffbffb);
  }
  pSVar1 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec37,(PCWSTR)0x0);
}

Assistant:

SharedArrayBuffer::SharedArrayBuffer(SharedContents * contents, DynamicType * type) :
        ArrayBufferBase(type), sharedContents(nullptr)
    {
        if (contents == nullptr || contents->bufferLength > MaxSharedArrayBufferLength)
        {
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_FunctionArgument_Invalid);
        }

        if (contents->AddRef() > 1)
        {
            sharedContents = contents;
        }
        else
        {
            Js::Throw::FatalInternalError();
        }
#if DBG
        sharedContents->AddAgent((DWORD_PTR)GetScriptContext());
#endif
    }